

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferAtomicFunctions.cpp
# Opt level: O0

IterateResult __thiscall
glcts::TextureBufferAtomicFunctions::iterate(TextureBufferAtomicFunctions *this)

{
  int iVar1;
  deUint32 dVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  TestLog *this_00;
  MessageBuilder *pMVar4;
  MessageBuilder local_1b0;
  uint local_30;
  uint local_2c;
  GLuint i;
  GLuint expected_value;
  GLuint *result;
  long lStack_18;
  bool test_result;
  Functions *gl;
  TextureBufferAtomicFunctions *this_local;
  
  gl = (Functions *)this;
  initTest(this);
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  lStack_18 = CONCAT44(extraout_var,iVar1);
  result._7_1_ = 1;
  (**(code **)(lStack_18 + 0x1680))(this->m_po_id);
  dVar2 = (**(code **)(lStack_18 + 0x800))();
  glu::checkError(dVar2,"Error setting active program object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferAtomicFunctions.cpp"
                  ,0xb5);
  (**(code **)(lStack_18 + 0x80))(0,this->m_tbo_tex_id,0,0,0,0x88ba,0x8236);
  dVar2 = (**(code **)(lStack_18 + 0x800))();
  glu::checkError(dVar2,"Error binding texture object to image unit 0!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferAtomicFunctions.cpp"
                  ,0xb8);
  (**(code **)(lStack_18 + 0x528))(1,1);
  dVar2 = (**(code **)(lStack_18 + 0x800))();
  glu::checkError(dVar2,"Error running compute shader!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferAtomicFunctions.cpp"
                  ,0xbb);
  (**(code **)(lStack_18 + 0xdb8))(0x200);
  dVar2 = (**(code **)(lStack_18 + 0x800))();
  glu::checkError(dVar2,"Error setting memory barrier!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferAtomicFunctions.cpp"
                  ,0xbe);
  _i = (**(code **)(lStack_18 + 0xd00))
                 ((this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,0,
                  (ulong)this->m_n_texels_in_texture_buffer << 2,1);
  dVar2 = (**(code **)(lStack_18 + 0x800))();
  glu::checkError(dVar2,"Error mapping buffer object\'s data store to client address space!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferAtomicFunctions.cpp"
                  ,0xc3);
  local_2c = this->m_n_texels_in_texture_buffer * (this->m_n_texels_in_texture_buffer - 1) >> 1;
  local_30 = 0;
  do {
    if (this->m_n_texels_in_texture_buffer <= local_30) {
LAB_016484f2:
      (**(code **)(lStack_18 + 0x1670))((this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER);
      if ((result._7_1_ & 1) == 0) {
        tcu::TestContext::setTestResult
                  ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Fail");
      }
      else {
        tcu::TestContext::setTestResult
                  ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_PASS,"Pass");
      }
      return STOP;
    }
    if (*(uint *)(_i + (ulong)local_30 * 4) != local_2c) {
      this_00 = tcu::TestContext::getLog
                          ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_1b0,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar4 = tcu::MessageBuilder::operator<<
                         (&local_1b0,(char (*) [45])"Result is different than expected at index: ");
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_30);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [2])0x2b9e07b);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [17])0x2adf44c);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_2c);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [2])0x2b9e07b);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [17])"Result   value: ");
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(uint *)(_i + (ulong)local_30 * 4));
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [2])0x2b9e07b);
      tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_1b0);
      result._7_1_ = 0;
      goto LAB_016484f2;
    }
    local_30 = local_30 + 1;
  } while( true );
}

Assistant:

tcu::TestNode::IterateResult TextureBufferAtomicFunctions::iterate(void)
{
	/* Initialize */
	initTest();

	/* Get Gl entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	bool test_result = true;

	gl.useProgram(m_po_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting active program object!");

	gl.bindImageTexture(0, m_tbo_tex_id, 0, GL_FALSE, 0, GL_READ_WRITE, GL_R32UI);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding texture object to image unit 0!");

	gl.dispatchCompute(1, 1, 1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error running compute shader!");

	gl.memoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting memory barrier!");

	/* Get result data */
	glw::GLuint* result = (glw::GLuint*)gl.mapBufferRange(
		m_glExtTokens.TEXTURE_BUFFER, 0, m_n_texels_in_texture_buffer * sizeof(glw::GLuint), GL_MAP_READ_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error mapping buffer object's data store to client address space!");

	glw::GLuint expected_value = (m_n_texels_in_texture_buffer * (m_n_texels_in_texture_buffer - 1)) / 2;

	for (glw::GLuint i = 0; i < m_n_texels_in_texture_buffer; ++i)
	{
		/* Log error if expected data and result data are not equal */
		if (result[i] != expected_value)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Result is different than expected at index: " << i << "\n"
							   << "Expected value: " << expected_value << "\n"
							   << "Result   value: " << result[i] << "\n"
							   << tcu::TestLog::EndMessage;

			test_result = false;
			break;
		}
	}

	gl.unmapBuffer(m_glExtTokens.TEXTURE_BUFFER);

	if (test_result)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}